

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor_t.h
# Opt level: O2

void __thiscall tensor_t<float>::tensor_t(tensor_t<float> *this,tensor_t<float> *other)

{
  int iVar1;
  long lVar2;
  float *__dest;
  ulong uVar3;
  size_t __n;
  
  lVar2 = (long)(other->size).z * (long)(other->size).y * (long)(other->size).x;
  __n = lVar2 * 4;
  uVar3 = 0xffffffffffffffff;
  if (-1 < (int)lVar2) {
    uVar3 = __n;
  }
  __dest = (float *)operator_new__(uVar3);
  this->data = __dest;
  memcpy(__dest,other->data,__n);
  iVar1 = (other->size).y;
  (this->size).x = (other->size).x;
  (this->size).y = iVar1;
  (this->size).z = (other->size).z;
  return;
}

Assistant:

tensor_t( const tensor_t& other )
	{
		data = new T[other.size.x *other.size.y *other.size.z];
		memcpy(
			this->data,
			other.data,
			other.size.x *other.size.y *other.size.z * sizeof( T )
		);
		this->size = other.size;
	}